

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_llvm_builtins.cpp
# Opt level: O3

AllocaTrackedIndex *
dxil_spv::gep_pointer_to_alloca_tracked_inst
          (AllocaTrackedIndex *__return_storage_ptr__,Impl *impl,Value *ptr)

{
  AllocaTrackedIndex *pAVar1;
  ValueKind VVar2;
  _Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
  in_RAX;
  Instruction *this;
  undefined4 extraout_var;
  AllocaInst *this_00;
  undefined4 extraout_var_00;
  Value *pVVar3;
  AllocaInst *alloca_inst;
  AllocaInst *local_28;
  
  if (ptr != (Value *)0x0) {
    this = (Instruction *)LLVMBC::Internal::resolve_proxy(ptr);
    VVar2 = LLVMBC::Value::get_value_kind((Value *)this);
    in_RAX._M_cur = (__node_type *)CONCAT44(extraout_var,VVar2);
    if ((VVar2 == GetElementPtr) &&
       (in_RAX._M_cur = (__node_type *)LLVMBC::Instruction::getOperand(this,0),
       in_RAX._M_cur != (__node_type *)0x0)) {
      this_00 = (AllocaInst *)LLVMBC::Internal::resolve_proxy((Value *)in_RAX._M_cur);
      VVar2 = LLVMBC::Value::get_value_kind((Value *)this_00);
      in_RAX._M_cur = (__node_type *)CONCAT44(extraout_var_00,VVar2);
      if ((VVar2 == Alloca) &&
         (local_28 = this_00,
         in_RAX._M_cur =
              (__node_type *)
              std::
              _Hashtable<const_LLVMBC::AllocaInst_*,_std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::AllocaInst_*>,_std::hash<const_LLVMBC::AllocaInst_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&(impl->alloca_tracking)._M_h,&local_28), in_RAX._M_cur != (__node_type *)0x0))
      {
        __return_storage_ptr__->alloca_inst = local_28;
        pVVar3 = LLVMBC::Instruction::getOperand(this,2);
        __return_storage_ptr__->index = pVVar3;
        (__return_storage_ptr__->itr).
        super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
        ._M_cur = in_RAX._M_cur;
        pAVar1 = *(AllocaTrackedIndex **)((long)in_RAX._M_cur + 0x10);
        __return_storage_ptr__->cbv_handle = (Value *)pAVar1;
        return pAVar1;
      }
    }
  }
  (__return_storage_ptr__->itr).
  super__Node_iterator_base<std::pair<const_LLVMBC::AllocaInst_*const,_dxil_spv::AllocaCBVForwardingTracking>,_false>
  ._M_cur = (__node_type *)0x0;
  __return_storage_ptr__->cbv_handle = (Value *)0x0;
  __return_storage_ptr__->alloca_inst = (AllocaInst *)0x0;
  __return_storage_ptr__->index = (Value *)0x0;
  return (AllocaTrackedIndex *)in_RAX._M_cur;
}

Assistant:

static AllocaTrackedIndex gep_pointer_to_alloca_tracked_inst(Converter::Impl &impl, const llvm::Value *ptr)
{
	if (const auto *gep_inst = llvm::dyn_cast<llvm::GetElementPtrInst>(ptr))
	{
		if (const auto *alloca_inst = llvm::dyn_cast<llvm::AllocaInst>(gep_inst->getOperand(0)))
		{
			auto itr = impl.alloca_tracking.find(alloca_inst);
			if (itr != impl.alloca_tracking.end())
				return { alloca_inst, gep_inst->getOperand(2), itr, itr->second.cbv_handle };
		}
	}

	return {};
}